

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

Image * vera::mergeChannels(Image *__return_storage_ptr__,Image *_red,Image *_green,Image *_blue)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  size_t _index;
  float _x;
  float _y;
  float _z;
  vec<3,_float,_(glm::qualifier)0> local_58 [2];
  int local_40;
  int local_3c;
  int index;
  int x;
  int y;
  int local_2c;
  int height;
  int width;
  Image *_blue_local;
  Image *_green_local;
  Image *_red_local;
  Image *out;
  
  _height = _blue;
  _blue_local = _green;
  _green_local = _red;
  _red_local = __return_storage_ptr__;
  iVar1 = (*_red->_vptr_Image[8])();
  if (((iVar1 < 2) && (iVar1 = (*_blue_local->_vptr_Image[8])(), iVar1 < 2)) &&
     (iVar1 = (*_height->_vptr_Image[8])(), iVar1 < 2)) {
    iVar1 = (*_green_local->_vptr_Image[6])();
    iVar2 = (*_blue_local->_vptr_Image[6])();
    if (iVar1 == iVar2) {
      iVar1 = (*_green_local->_vptr_Image[6])();
      iVar2 = (*_height->_vptr_Image[6])();
      if (iVar1 == iVar2) {
        iVar1 = (*_green_local->_vptr_Image[7])();
        iVar2 = (*_blue_local->_vptr_Image[7])();
        if (iVar1 == iVar2) {
          iVar1 = (*_green_local->_vptr_Image[7])();
          iVar2 = (*_height->_vptr_Image[7])();
          if (iVar1 == iVar2) {
            local_2c = (*_green_local->_vptr_Image[6])();
            y = (*_green_local->_vptr_Image[7])();
            x._3_1_ = 0;
            Image::Image(__return_storage_ptr__,local_2c,y,3);
            for (index = 0; index < y; index = index + 1) {
              for (local_3c = 0; local_3c < local_2c; local_3c = local_3c + 1) {
                local_40 = (*_green_local->_vptr_Image[0xe])
                                     (_green_local,(long)local_3c,(long)index);
                _index = Image::getIndex(__return_storage_ptr__,(long)local_3c,(long)index);
                (*_green_local->_vptr_Image[0x18])(_green_local,(long)local_40);
                (*_blue_local->_vptr_Image[0x18])(_blue_local,(long)local_40);
                (*_height->_vptr_Image[0x18])(_height,(long)local_40);
                glm::vec<3,_float,_(glm::qualifier)0>::vec(local_58,_x,_y,_z);
                Image::setColor(__return_storage_ptr__,_index,local_58);
              }
            }
            return __return_storage_ptr__;
          }
        }
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ERROR: mergeChannel() all images must be the same size");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Image::Image(__return_storage_ptr__,_blue_local);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "ERROR: mergeChannel() arguments must be all grayscale images");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Image::Image(__return_storage_ptr__,_green_local);
  }
  return __return_storage_ptr__;
}

Assistant:

Image mergeChannels(const Image& _red, const Image& _green, const Image& _blue) {
    if (_red.getChannels() > 1 ||
        _green.getChannels() > 1 ||
        _blue.getChannels() > 1 ) {
        std::cout << "ERROR: mergeChannel() arguments must be all grayscale images" << std::endl;
        return _red;
    }

    if (_red.getWidth() != _green.getWidth() || _red.getWidth() != _blue.getWidth() ||
        _red.getHeight() != _green.getHeight() || _red.getHeight() != _blue.getHeight()) {
        std::cout << "ERROR: mergeChannel() all images must be the same size" << std::endl;
        return _green;
    }
    int width = _red.getWidth();
    int height = _red.getHeight();
    Image out = Image(width, height, 3);
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++) {
            int index = _red.getIndex(x, y);
            out.setColor(   out.getIndex(x,y), 
                            glm::vec3(_red.getValue(index), _green.getValue(index), _blue.getValue(index)));
        }
    }
    return out;
}